

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

Value * __thiscall
wabt::interp::Instance::ResolveInitExpr
          (Value *__return_storage_ptr__,Instance *this,Store *store,InitExpr init)

{
  undefined8 uVar1;
  u64 uVar2;
  RefPtr<wabt::interp::Global> local_28;
  
  (__return_storage_ptr__->field_0).i64_ = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->field_0 + 8) = 0;
  (__return_storage_ptr__->type).enum_ = Any;
  uVar2 = init.field_1._0_8_;
  switch(init.kind) {
  case None:
    abort();
  case I32:
    (__return_storage_ptr__->field_0).i32_ = init.field_1.i32_;
    (__return_storage_ptr__->type).enum_ = I32;
    break;
  case I64:
    (__return_storage_ptr__->field_0).i64_ = uVar2;
    (__return_storage_ptr__->type).enum_ = I64;
    break;
  case F32:
    (__return_storage_ptr__->field_0).i32_ = init.field_1.i32_;
    (__return_storage_ptr__->type).enum_ = F32;
    break;
  case F64:
    (__return_storage_ptr__->field_0).i64_ = uVar2;
    (__return_storage_ptr__->type).enum_ = F64;
    break;
  case V128:
    (__return_storage_ptr__->field_0).i64_ = uVar2;
    *(undefined8 *)((long)&__return_storage_ptr__->field_0 + 8) = init.field_1._8_8_;
    (__return_storage_ptr__->type).enum_ = V128;
    break;
  case GlobalGet:
    RefPtr<wabt::interp::Global>::RefPtr
              (&local_28,store,
               (Ref)(this->globals_).
                    super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                    _M_impl.super__Vector_impl_data._M_start[init.field_1.i32_].index);
    (__return_storage_ptr__->type).enum_ = ((local_28.obj_)->value_).type.enum_;
    uVar1 = *(undefined8 *)((long)&((local_28.obj_)->value_).field_0 + 8);
    (__return_storage_ptr__->field_0).i64_ = ((local_28.obj_)->value_).field_0.i64_;
    *(undefined8 *)((long)&__return_storage_ptr__->field_0 + 8) = uVar1;
    if (local_28.obj_ != (Global *)0x0) {
      FreeList<wabt::interp::Ref>::Delete(&(local_28.store_)->roots_,local_28.root_index_);
    }
    break;
  case RefNull:
    (__return_storage_ptr__->field_0).i64_ = 0;
    goto LAB_0018b432;
  case RefFunc:
    (__return_storage_ptr__->field_0).i64_ =
         (this->funcs_).super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
         _M_impl.super__Vector_impl_data._M_start[init.field_1.i32_].index;
LAB_0018b432:
    (__return_storage_ptr__->type).enum_ = ExternRef;
  }
  return __return_storage_ptr__;
}

Assistant:

Value Instance::ResolveInitExpr(Store& store, InitExpr init) {
  Value result;
  switch (init.kind) {
    case InitExprKind::I32:      result.Set(init.i32_); break;
    case InitExprKind::I64:      result.Set(init.i64_); break;
    case InitExprKind::F32:      result.Set(init.f32_); break;
    case InitExprKind::F64:      result.Set(init.f64_); break;
    case InitExprKind::V128:     result.Set(init.v128_); break;
    case InitExprKind::GlobalGet: {
      Global::Ptr global{store, globals_[init.index_]};
      result = global->Get();
      break;
    }
    case InitExprKind::RefFunc: {
      result.Set(funcs_[init.index_]);
      break;
    }
    case InitExprKind::RefNull:
      result.Set(Ref::Null);
      break;

    case InitExprKind::None:
      WABT_UNREACHABLE;
  }
  return result;
}